

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

cmFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,string *obj,string *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_bool>
  pVar3;
  value_type entry;
  cmFortranSourceInfo local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  local_130;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
          ::find(&(this->ObjectInfo)._M_t,obj);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->ObjectInfo)._M_t._M_impl.super__Rb_tree_header) {
    memset(&local_210,0,0xe0);
    paVar1 = &local_210.Source.field_2;
    local_210.Source._M_string_length = 0;
    local_210.Source.field_2._M_local_buf[0] = '\0';
    local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210.Source._M_dataplus._M_p = (pointer)paVar1;
    local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::pair<cmFortranSourceInfo,_true>(&local_130,obj,&local_210);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_210.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_210.Intrinsics._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_210.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_210.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Source._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.Source._M_dataplus._M_p,
                      CONCAT71(local_210.Source.field_2._M_allocated_capacity._1_7_,
                               local_210.Source.field_2._M_local_buf[0]) + 1);
    }
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
                        *)&this->ObjectInfo,&local_130);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::__cxx11::string::_M_assign((string *)(iVar2._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.second.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.second.Intrinsics._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.second.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.second.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.second.Source._M_dataplus._M_p != &local_130.second.Source.field_2) {
      operator_delete(local_130.second.Source._M_dataplus._M_p,
                      local_130.second.Source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.first._M_dataplus._M_p != &local_130.first.field_2) {
      operator_delete(local_130.first._M_dataplus._M_p,
                      local_130.first.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmFortranSourceInfo *)(iVar2._M_node + 2);
}

Assistant:

cmFortranSourceInfo& CreateObjectInfo(const std::string& obj,
                                        const std::string& src)
  {
    auto i = this->ObjectInfo.find(obj);
    if (i == this->ObjectInfo.end()) {
      std::map<std::string, cmFortranSourceInfo>::value_type entry(
        obj, cmFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
    }
    return i->second;
  }